

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O1

string * StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  size_t sVar1;
  char local_1e8 [8];
  char buf [256];
  undefined8 local_38;
  va_list ap;
  
  ap[0].overflow_arg_area = buf + 0xf8;
  ap[0]._0_8_ = &stack0x00000008;
  local_38 = 0x3000000010;
  vsnprintf(local_1e8,0x100,format,&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_1e8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1e8,local_1e8 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string StringPrintf(const char* format, ...) {
  char buf[256];   // should be big enough for all logging
  va_list ap;
  va_start(ap, format);
  vsnprintf(buf, sizeof(buf), format, ap);
  va_end(ap);
  return buf;
}